

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::MultiTextureSamplerTest::iterate(MultiTextureSamplerTest *this)

{
  TestLog *log;
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint x;
  char *description;
  uint y;
  Surface samplerResult;
  Surface textureResult;
  Surface samplerRef;
  Surface textureRef;
  RGBA local_8c;
  Surface local_88;
  Surface local_70;
  Surface local_58;
  Surface local_40;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_40,0x80,0x80);
  tcu::Surface::Surface(&local_58,0x80,0x80);
  tcu::Surface::Surface(&local_70,0x80,0x80);
  tcu::Surface::Surface(&local_88,0x80,0x80);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  dVar4 = deRandom_getUint32(&(this->m_random).m_rnd);
  x = dVar4 % (iVar3 - 0x7fU);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  dVar4 = deRandom_getUint32(&(this->m_random).m_rnd);
  y = dVar4 % (iVar3 - 0x7fU);
  renderReferences(this,&local_40,&local_58,x,y);
  renderResults(this,&local_70,&local_88,x,y);
  local_8c.m_value = 0;
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Sampler render result","Result from rendering with sampler",&local_58,
                     &local_88,&local_8c,COMPARE_LOG_RESULT);
  local_8c.m_value = 0;
  bVar2 = tcu::pixelThresholdCompare
                    (log,"Texture render result","Result from rendering with texture state",
                     &local_40,&local_70,&local_8c,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar1 && bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(!bVar1 || !bVar2),description);
  tcu::Surface::~Surface(&local_88);
  tcu::Surface::~Surface(&local_70);
  tcu::Surface::~Surface(&local_58);
  tcu::Surface::~Surface(&local_40);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MultiTextureSamplerTest::iterate (void)
{
	tcu::TestLog&	log = m_testCtx.getLog();

	tcu::Surface	textureRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	tcu::Surface	textureResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	int				x = m_random.getInt(0, m_renderCtx.getRenderTarget().getWidth() - VIEWPORT_WIDTH);
	int				y = m_random.getInt(0, m_renderCtx.getRenderTarget().getHeight() - VIEWPORT_HEIGHT);

	renderReferences(textureRef, samplerRef, x, y);
	renderResults(textureResult, samplerResult, x, y);

	bool isOk = pixelThresholdCompare (log, "Sampler render result", "Result from rendering with sampler", samplerRef, samplerResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	if (!pixelThresholdCompare (log, "Texture render result", "Result from rendering with texture state", textureRef, textureResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
		isOk = false;

	if (!isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}